

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_SignTransactionTest_Test::TestBody
          (cfdcapi_transaction_SignTransactionTest_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *in_R9;
  long *expected_predicate_value;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  int tmp_ret;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  char *tapscript_err_msg;
  char *err_msg;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  char *tx_hex;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  uint32_t code_separator_pos;
  AssertionResult gtest_ar_4;
  bool has_tapscript;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  undefined1 in_stack_0000069f;
  int in_stack_000006a0;
  uint32_t in_stack_000006a4;
  char *in_stack_000006a8;
  AssertionResult gtest_ar_1;
  char *tmp_sig;
  char *sig;
  char *sighash;
  void *create_handle;
  size_t idx;
  size_t list_size;
  CfdSignTransactionTestData exp_datas [7];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined1 in_stack_00000bbf;
  char *in_stack_00000bc0;
  int64_t in_stack_00000bc8;
  uint32_t in_stack_00000bd4;
  char *in_stack_00000bd8;
  void *in_stack_00000be0;
  void *in_stack_00000be8;
  char *in_stack_00000c00;
  char *in_stack_00000c08;
  char *in_stack_00000c10;
  char *in_stack_00000c18;
  bool *in_stack_fffffffffffff4a8;
  AssertionResult *in_stack_fffffffffffff4b0;
  undefined4 uVar7;
  int *piVar6;
  undefined4 uVar8;
  CfdErrorCode *in_stack_fffffffffffff4b8;
  char *in_stack_fffffffffffff4c0;
  undefined4 uVar9;
  void **in_stack_fffffffffffff4c8;
  char **in_stack_fffffffffffff540;
  AssertionResult *in_stack_fffffffffffff548;
  char **in_stack_fffffffffffff630;
  AssertionResult *in_stack_fffffffffffff638;
  undefined7 in_stack_fffffffffffff640;
  undefined1 in_stack_fffffffffffff647;
  char *in_stack_fffffffffffff648;
  bool *local_958;
  AssertionResult *this_00;
  int in_stack_fffffffffffff720;
  uint32_t in_stack_fffffffffffff724;
  char *in_stack_fffffffffffff728;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffff738;
  AssertHelper local_898;
  Message local_890;
  undefined4 local_884;
  AssertionResult local_880;
  AssertHelper local_870;
  undefined1 in_stack_fffffffffffff79b;
  int in_stack_fffffffffffff79c;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  char *in_stack_fffffffffffff7a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7bc;
  AssertHelper local_840;
  Message local_838;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  AssertionResult local_828;
  AssertHelper local_818;
  Message local_810;
  undefined4 local_804;
  AssertionResult local_800;
  AssertHelper local_7f0;
  Message local_7e8 [2];
  char **in_stack_fffffffffffff828;
  char *in_stack_fffffffffffff830;
  char *in_stack_fffffffffffff838;
  AssertHelper in_stack_fffffffffffff840;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff848;
  AssertionResult local_7b0;
  AssertHelper local_7a0;
  Message local_798;
  undefined4 local_78c;
  AssertionResult local_788;
  char *local_778;
  AssertHelper local_770;
  Message local_768;
  undefined4 local_75c;
  AssertionResult local_758;
  AssertHelper local_748;
  Message local_740;
  undefined4 local_734;
  AssertionResult local_730;
  undefined1 in_stack_fffffffffffff8e2;
  undefined1 in_stack_fffffffffffff8e3;
  int in_stack_fffffffffffff8e4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  uint32_t in_stack_fffffffffffff8f4;
  char *in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  uint32_t in_stack_fffffffffffff904;
  AssertHelper in_stack_fffffffffffff908;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  AssertionResult local_6e0;
  AssertHelper in_stack_fffffffffffff930;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  uint32_t in_stack_fffffffffffff94c;
  uint32_t in_stack_fffffffffffff950;
  int in_stack_fffffffffffff954;
  AssertHelper in_stack_fffffffffffff958;
  Message local_6a0;
  undefined4 local_694;
  AssertionResult local_690;
  AssertHelper local_680;
  Message local_678;
  undefined4 local_66c;
  AssertionResult local_668;
  AssertHelper local_658;
  undefined1 in_stack_fffffffffffff9b5;
  undefined1 in_stack_fffffffffffff9b6;
  undefined1 in_stack_fffffffffffff9b7;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  int in_stack_fffffffffffff9c0;
  uint32_t in_stack_fffffffffffff9c4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9c8;
  undefined6 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d6;
  undefined1 in_stack_fffffffffffff9d7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9e0;
  uint32_t in_stack_fffffffffffff9e4;
  char *in_stack_fffffffffffff9e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  Message local_600;
  undefined4 local_5f4;
  char *in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa20;
  Message local_5d8;
  undefined4 local_5cc;
  AssertionResult local_5c8;
  AssertHelper local_5b8;
  Message local_5b0;
  undefined4 local_5a4;
  AssertionResult local_5a0;
  undefined4 local_58c;
  AssertHelper local_588;
  Message local_580;
  undefined4 local_574;
  AssertionResult local_570;
  byte local_559;
  AssertHelper local_558;
  Message local_550;
  undefined4 local_544;
  AssertionResult local_540;
  AssertHelper local_530;
  Message local_528;
  undefined4 local_51c;
  AssertionResult local_518;
  string local_508;
  AssertHelper local_4e8;
  Message local_4e0;
  undefined1 local_4d1;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined4 local_4ac;
  AssertionResult local_4a8;
  long local_498;
  bool *local_490;
  long local_488;
  long local_480;
  ulong local_478;
  ulong local_470;
  undefined1 local_468 [24];
  long alStack_450 [9];
  long alStack_408 [3];
  byte abStack_3f0 [8];
  byte abStack_3e8 [264];
  char *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  int64_t in_stack_fffffffffffffd38;
  void *in_stack_fffffffffffffd40;
  void *in_stack_fffffffffffffd48;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_79;
  AssertionResult local_78;
  AssertHelper local_68;
  Message local_60 [3];
  undefined4 local_44;
  AssertionResult local_40;
  int local_2c;
  long local_28;
  
  local_28 = 0;
  local_2c = CfdCreateHandle(in_stack_fffffffffffff4c8);
  local_44 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
             (int *)in_stack_fffffffffffff4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  local_958 = in_stack_fffffffffffff4a8;
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b8c8f);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x68,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x3b8cf2);
    local_958 = in_stack_fffffffffffff4a8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b8d47);
  local_79 = local_28 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff4b0,local_958,(type *)0x3b8d7b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&local_78,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x69,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message((Message *)0x3b8e77);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b8ef2);
  memcpy(local_468,&DAT_009f5940,0x3b8);
  local_470 = 7;
  for (local_478 = 0; local_478 < local_470; local_478 = local_478 + 1) {
    local_480 = 0;
    local_488 = 0;
    local_490 = (bool *)0x0;
    local_498 = 0;
    expected_predicate_value = &local_480;
    local_2c = CfdInitializeTransaction
                         (in_stack_fffffffffffff958.data_,in_stack_fffffffffffff954,
                          in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                          (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                          (void **)in_stack_fffffffffffff938.ptr_);
    local_4ac = 0;
    this_01 = &local_4a8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8
               ,(int *)in_stack_fffffffffffff4b0);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_4b8);
      in_stack_fffffffffffff728 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3b9056);
      testing::internal::AssertHelper::AssertHelper
                (&local_4c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0xf1,in_stack_fffffffffffff728);
      testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
      testing::internal::AssertHelper::~AssertHelper(&local_4c0);
      testing::Message::~Message((Message *)0x3b90b9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b910e);
    local_4d1 = local_480 != 0;
    this_00 = &local_4d0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffff4b0,local_958,(type *)0x3b9142);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    in_stack_fffffffffffff724 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff724);
    if (!bVar1) {
      testing::Message::Message(&local_4e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_508,(internal *)&local_4d0,(AssertionResult *)"(NULL == create_handle)",
                 "true","false",(char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0xf2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
      testing::internal::AssertHelper::~AssertHelper(&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      testing::Message::~Message((Message *)0x3b923e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b92b9);
    if (local_2c == 0) {
      local_958 = (bool *)alStack_450[local_478 * 0x11];
      in_stack_fffffffffffff4c8 =
           (void **)CONCAT44((int)((ulong)in_stack_fffffffffffff4c8 >> 0x20),1);
      in_stack_fffffffffffff4c0 = (char *)0x0;
      in_stack_fffffffffffff4b8 = (CfdErrorCode *)0x0;
      in_stack_fffffffffffff4b0 = (AssertionResult *)0x0;
      local_2c = CfdSetTransactionUtxoData
                           (in_stack_00000be8,in_stack_00000be0,in_stack_00000bd8,in_stack_00000bd4,
                            in_stack_00000bc8,in_stack_00000bc0,in_stack_00000c00,in_stack_00000c08,
                            in_stack_00000c10,in_stack_00000c18,(bool)in_stack_00000bbf);
      local_51c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                 in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
      if (!bVar1) {
        testing::Message::Message(&local_528);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b93ec);
        testing::internal::AssertHelper::AssertHelper
                  (&local_530,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0xf7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_530,&local_528);
        testing::internal::AssertHelper::~AssertHelper(&local_530);
        testing::Message::~Message((Message *)0x3b944f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b94a7);
      local_2c = CfdAddTransactionOutput
                           (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                            in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                            in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      local_544 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                 in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_540);
      if (!bVar1) {
        testing::Message::Message(&local_550);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b959b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_558,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0xfb,pcVar4);
        testing::internal::AssertHelper::operator=(&local_558,&local_550);
        testing::internal::AssertHelper::~AssertHelper(&local_558);
        testing::Message::~Message((Message *)0x3b95fe);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b9653);
      local_559 = 0;
      if (local_2c == 0) {
        if ((abStack_3e8[local_478 * 0x88] & 1) == 0) {
          local_58c = 0xffffffff;
          if (alStack_450[local_478 * 0x11 + 2] == 0) {
            local_958 = (bool *)alStack_408[local_478 * 0x11 + -2];
          }
          else {
            local_958 = (bool *)0x0;
          }
          in_stack_fffffffffffff4b0 = (AssertionResult *)alStack_450[local_478 * 0x11 + 2];
          in_stack_fffffffffffff4b8 = (CfdErrorCode *)alStack_450[local_478 * 0x11 + 4];
          in_stack_fffffffffffff4c8 = (void **)alStack_408[local_478 * 0x11 + -4];
          in_stack_fffffffffffff4c0 =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffff4c0 >> 0x20),0xffffffff);
          local_2c = CfdCreateSighashByHandle
                               (gtest_ar_1.message_.ptr_,(void *)gtest_ar_1._0_8_,in_stack_000006a8,
                                in_stack_000006a4,in_stack_000006a0,(bool)in_stack_0000069f,sighash,
                                (char *)create_handle,(char *)idx,(uint32_t)list_size,
                                (char *)exp_datas[0]._0_8_,(char **)exp_datas[0].txid);
          local_5a4 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                     in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5a0);
          if (!bVar1) {
            testing::Message::Message(&local_5b0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b9a89);
            testing::internal::AssertHelper::AssertHelper
                      (&local_5b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x10f,pcVar4);
            testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
            testing::internal::AssertHelper::~AssertHelper(&local_5b8);
            testing::Message::~Message((Message *)0x3b9aec);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b9b41);
          if (local_2c == 0) {
            sVar5 = strlen((char *)alStack_408[local_478 * 0x11 + -2]);
            if (sVar5 == 0x40) {
              local_2c = CfdSignSchnorr(in_stack_fffffffffffff848.ptr_,
                                        (char *)in_stack_fffffffffffff840.data_,
                                        in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                                        in_stack_fffffffffffff828);
              local_5cc = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5c8);
              if (!bVar1) {
                testing::Message::Message(&local_5d8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b9c6e);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffa20,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x116,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffffa20,&local_5d8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffa20);
                testing::Message::~Message((Message *)0x3b9cd1);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b9d29);
              local_2c = CfdAddSighashTypeInSchnorrSignature
                                   (in_stack_fffffffffffff648,
                                    (char *)CONCAT17(in_stack_fffffffffffff647,
                                                     in_stack_fffffffffffff640),
                                    (int)((ulong)in_stack_fffffffffffff638 >> 0x20),
                                    SUB81((ulong)in_stack_fffffffffffff638 >> 0x18,0),
                                    in_stack_fffffffffffff630);
              local_5f4 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              uVar7 = (undefined4)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffa10);
              if (!bVar1) {
                testing::Message::Message(&local_600);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b9e16);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff9f8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x119,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff9f8,&local_600);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff9f8);
                testing::Message::~Message((Message *)0x3b9e79);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b9ed1);
              if (alStack_450[local_478 * 0x11 + 2] == 0) {
                in_stack_fffffffffffff4b0 = (AssertionResult *)alStack_408[local_478 * 0x11 + -4];
                local_958 = (bool *)0x0;
                local_2c = CfdAddTaprootSignByHandle
                                     ((void *)CONCAT44(in_stack_fffffffffffff91c,
                                                       in_stack_fffffffffffff918),
                                      in_stack_fffffffffffff910.ptr_,
                                      (char *)in_stack_fffffffffffff908.data_,
                                      in_stack_fffffffffffff904,in_stack_fffffffffffff8f8,
                                      (char *)CONCAT44(in_stack_fffffffffffff8f4,
                                                       in_stack_fffffffffffff8f0),
                                      (char *)in_stack_fffffffffffff930.data_,
                                      (char *)in_stack_fffffffffffff938.ptr_);
                local_66c = 0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                           in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_668);
                if (!bVar1) {
                  testing::Message::Message(&local_678);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3ba3b1);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_680,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,300,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_680,&local_678);
                  testing::internal::AssertHelper::~AssertHelper(&local_680);
                  testing::Message::~Message((Message *)0x3ba414);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ba469);
              }
              else {
                local_559 = 1;
                piVar6 = (int *)CONCAT44(uVar7,(int)alStack_408[local_478 * 0x11]);
                in_stack_fffffffffffff4c0 =
                     (char *)CONCAT44((int)((ulong)in_stack_fffffffffffff4c0 >> 0x20),1);
                in_stack_fffffffffffff4b8 =
                     (CfdErrorCode *)((ulong)in_stack_fffffffffffff4b8 & 0xffffffff00000000);
                local_2c = CfdAddTxSignByHandle
                                     (in_stack_fffffffffffff9d8.ptr_,
                                      (void *)CONCAT17(in_stack_fffffffffffff9d7,
                                                       CONCAT16(in_stack_fffffffffffff9d6,
                                                                in_stack_fffffffffffff9d0)),
                                      (char *)in_stack_fffffffffffff9c8.ptr_,
                                      in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                                      (char *)CONCAT44(in_stack_fffffffffffff9bc,
                                                       in_stack_fffffffffffff9b8),
                                      (bool)in_stack_fffffffffffff9b7,in_stack_fffffffffffff9f8,
                                      (bool)in_stack_fffffffffffff9b6,
                                      (bool)in_stack_fffffffffffff9b5);
                in_stack_fffffffffffff9e4 = 0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                           in_stack_fffffffffffff4b8,piVar6);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffff9e8);
                if (!bVar1) {
                  testing::Message::Message((Message *)&stack0xfffffffffffff9d8);
                  in_stack_fffffffffffff648 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x3ba019);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffff9d0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x121,in_stack_fffffffffffff648);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xfffffffffffff9d0,
                             (Message *)&stack0xfffffffffffff9d8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffff9d0);
                  testing::Message::~Message((Message *)0x3ba07c);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ba0d4);
                local_958 = (bool *)alStack_450[local_478 * 0x11 + 3];
                in_stack_fffffffffffff4b0 = (AssertionResult *)alStack_408[local_478 * 0x11 + -4];
                local_2c = CfdAddTaprootSignByHandle
                                     ((void *)CONCAT44(in_stack_fffffffffffff91c,
                                                       in_stack_fffffffffffff918),
                                      in_stack_fffffffffffff910.ptr_,
                                      (char *)in_stack_fffffffffffff908.data_,
                                      in_stack_fffffffffffff904,in_stack_fffffffffffff8f8,
                                      (char *)CONCAT44(in_stack_fffffffffffff8f4,
                                                       in_stack_fffffffffffff8f0),
                                      (char *)in_stack_fffffffffffff930.data_,
                                      (char *)in_stack_fffffffffffff938.ptr_);
                in_stack_fffffffffffff9bc = 0;
                in_stack_fffffffffffff638 = (AssertionResult *)&stack0xfffffffffffff9c0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                           in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
                in_stack_fffffffffffff647 =
                     testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff638);
                if (!(bool)in_stack_fffffffffffff647) {
                  testing::Message::Message((Message *)&stack0xfffffffffffff9b0);
                  in_stack_fffffffffffff630 =
                       (char **)testing::AssertionResult::failure_message
                                          ((AssertionResult *)0x3ba1e6);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_658,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x127,(char *)in_stack_fffffffffffff630);
                  testing::internal::AssertHelper::operator=
                            (&local_658,(Message *)&stack0xfffffffffffff9b0);
                  testing::internal::AssertHelper::~AssertHelper(&local_658);
                  testing::Message::~Message((Message *)0x3ba249);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ba29e);
              }
            }
            else if (alStack_450[local_478 * 0x11 + 2] == 0) {
              local_2c = CfdCalculateEcSignature
                                   ((void *)CONCAT44(in_stack_fffffffffffff7bc,
                                                     in_stack_fffffffffffff7b8),
                                    (char *)in_stack_fffffffffffff7b0.ptr_,in_stack_fffffffffffff7a8
                                    ,(char *)CONCAT44(in_stack_fffffffffffff7a4,
                                                      in_stack_fffffffffffff7a0),
                                    in_stack_fffffffffffff79c,(bool)in_stack_fffffffffffff79b,
                                    (char **)CONCAT44(in_stack_fffffffffffff7d4,
                                                      in_stack_fffffffffffff7d0));
              local_734 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              uVar7 = (undefined4)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
              uVar8 = (undefined4)((ulong)in_stack_fffffffffffff4b8 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_730);
              if (!bVar1) {
                testing::Message::Message(&local_740);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bacbe);
                testing::internal::AssertHelper::AssertHelper
                          (&local_748,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x14a,pcVar4);
                testing::internal::AssertHelper::operator=(&local_748,&local_740);
                testing::internal::AssertHelper::~AssertHelper(&local_748);
                testing::Message::~Message((Message *)0x3bad21);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bad79);
              in_stack_fffffffffffff4b8 =
                   (CfdErrorCode *)CONCAT44(uVar8,(int)alStack_408[local_478 * 0x11]);
              in_stack_fffffffffffff4c0 =
                   (char *)((ulong)in_stack_fffffffffffff4c0 & 0xffffffff00000000);
              in_stack_fffffffffffff4b0 = (AssertionResult *)CONCAT44(uVar7,1);
              local_958 = local_490;
              local_2c = CfdAddPubkeyHashSignByHandle
                                   ((void *)CONCAT44(in_stack_fffffffffffff9fc,
                                                     in_stack_fffffffffffff9f8),
                                    in_stack_fffffffffffff9f0.ptr_,in_stack_fffffffffffff9e8,
                                    in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0,
                                    (char *)in_stack_fffffffffffff9d8.ptr_,in_stack_fffffffffffffa10
                                    ,(bool)in_stack_fffffffffffff9d7,in_stack_fffffffffffffa20,
                                    (bool)in_stack_fffffffffffff9d6);
              local_75c = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_758);
              if (!bVar1) {
                testing::Message::Message(&local_768);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bae9c);
                testing::internal::AssertHelper::AssertHelper
                          (&local_770,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x150,pcVar4);
                testing::internal::AssertHelper::operator=(&local_770,&local_768);
                testing::internal::AssertHelper::~AssertHelper(&local_770);
                testing::Message::~Message((Message *)0x3baeff);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3baf54);
            }
            else {
              uVar7 = (undefined4)((ulong)&local_490 >> 0x20);
              local_2c = CfdCalculateEcSignature
                                   ((void *)CONCAT44(in_stack_fffffffffffff7bc,
                                                     in_stack_fffffffffffff7b8),
                                    (char *)in_stack_fffffffffffff7b0.ptr_,in_stack_fffffffffffff7a8
                                    ,(char *)CONCAT44(in_stack_fffffffffffff7a4,
                                                      in_stack_fffffffffffff7a0),
                                    in_stack_fffffffffffff79c,(bool)in_stack_fffffffffffff79b,
                                    (char **)CONCAT44(in_stack_fffffffffffff7d4,
                                                      in_stack_fffffffffffff7d0));
              local_694 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              uVar9 = (undefined4)((ulong)in_stack_fffffffffffff4c0 >> 0x20);
              uVar8 = (undefined4)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_690);
              if (!bVar1) {
                testing::Message::Message(&local_6a0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3ba596);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff958,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x133,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff958,&local_6a0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff958);
                testing::Message::~Message((Message *)0x3ba5f9);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ba651);
              piVar6 = (int *)CONCAT44(uVar8,(int)alStack_408[local_478 * 0x11]);
              in_stack_fffffffffffff4c0 = (char *)CONCAT44(uVar9,1);
              in_stack_fffffffffffff4b8 =
                   (CfdErrorCode *)((ulong)in_stack_fffffffffffff4b8 & 0xffffffff00000000);
              local_2c = CfdAddTxSignByHandle
                                   (in_stack_fffffffffffff9d8.ptr_,
                                    (void *)CONCAT17(in_stack_fffffffffffff9d7,
                                                     CONCAT16(in_stack_fffffffffffff9d6,
                                                              in_stack_fffffffffffff9d0)),
                                    (char *)in_stack_fffffffffffff9c8.ptr_,in_stack_fffffffffffff9c4
                                    ,in_stack_fffffffffffff9c0,
                                    (char *)CONCAT44(in_stack_fffffffffffff9bc,
                                                     in_stack_fffffffffffff9b8),
                                    (bool)in_stack_fffffffffffff9b7,in_stack_fffffffffffff9f8,
                                    (bool)in_stack_fffffffffffff9b6,(bool)in_stack_fffffffffffff9b5)
              ;
              in_stack_fffffffffffff944 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,piVar6);
              uVar8 = (undefined4)((ulong)piVar6 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffff948);
              if (!bVar1) {
                testing::Message::Message((Message *)&stack0xfffffffffffff938);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3ba76e);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff930,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x13a,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff930,
                           (Message *)&stack0xfffffffffffff938);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff930);
                testing::Message::~Message((Message *)0x3ba7d1);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ba829);
              in_stack_fffffffffffff4b0 =
                   (AssertionResult *)CONCAT44(uVar8,(int)alStack_408[local_478 * 0x11]);
              in_stack_fffffffffffff4c0 =
                   (char *)((ulong)in_stack_fffffffffffff4c0 & 0xffffffff00000000);
              in_stack_fffffffffffff4b8 =
                   (CfdErrorCode *)((ulong)in_stack_fffffffffffff4b8 & 0xffffffff00000000);
              local_958 = (bool *)CONCAT44(uVar7,1);
              local_2c = CfdAddTxSignByHandle
                                   (in_stack_fffffffffffff9d8.ptr_,
                                    (void *)CONCAT17(in_stack_fffffffffffff9d7,
                                                     CONCAT16(in_stack_fffffffffffff9d6,
                                                              in_stack_fffffffffffff9d0)),
                                    (char *)in_stack_fffffffffffff9c8.ptr_,in_stack_fffffffffffff9c4
                                    ,in_stack_fffffffffffff9c0,
                                    (char *)CONCAT44(in_stack_fffffffffffff9bc,
                                                     in_stack_fffffffffffff9b8),
                                    (bool)in_stack_fffffffffffff9b7,in_stack_fffffffffffff9f8,
                                    (bool)in_stack_fffffffffffff9b6,(bool)in_stack_fffffffffffff9b5)
              ;
              in_stack_fffffffffffff91c = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6e0);
              if (!bVar1) {
                testing::Message::Message((Message *)&stack0xfffffffffffff910);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3ba947);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff908,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x140,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff908,
                           (Message *)&stack0xfffffffffffff910);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff908);
                testing::Message::~Message((Message *)0x3ba9aa);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3baa02);
              local_2c = CfdAddScriptHashLastSignByHandle
                                   ((void *)CONCAT17(uVar2,in_stack_fffffffffffff738),this_01,
                                    in_stack_fffffffffffff728,in_stack_fffffffffffff724,
                                    in_stack_fffffffffffff720,&this_00->success_);
              in_stack_fffffffffffff8f4 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffff8f8);
              if (!bVar1) {
                testing::Message::Message((Message *)&stack0xfffffffffffff8e8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3baafd);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff8e0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x145,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff8e0,
                           (Message *)&stack0xfffffffffffff8e8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff8e0);
                testing::Message::~Message((Message *)0x3bab60);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3babb5);
            }
          }
          if (local_488 != 0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
            local_488 = 0;
          }
          if (local_490 != (bool *)0x0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
            local_490 = (bool *)0x0;
          }
          if (local_498 != 0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
            local_498 = 0;
          }
        }
        else {
          in_stack_fffffffffffff4b8 = (CfdErrorCode *)alStack_408[local_478 * 0x11 + -3];
          in_stack_fffffffffffff4c0 = (char *)alStack_408[local_478 * 0x11 + -4];
          in_stack_fffffffffffff4b0 =
               (AssertionResult *)CONCAT44((int)((ulong)in_stack_fffffffffffff4b0 >> 0x20),1);
          local_958 = (bool *)((ulong)local_958 & 0xffffffff00000000);
          local_2c = CfdAddSignWithPrivkeyByHandle
                               (in_stack_fffffffffffff908.data_,
                                (void *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900
                                                ),in_stack_fffffffffffff8f8,
                                in_stack_fffffffffffff8f4,(char *)in_stack_fffffffffffff8e8.ptr_,
                                in_stack_fffffffffffff8e4,(bool)in_stack_fffffffffffff8e3,
                                (bool)in_stack_fffffffffffff8e2,
                                (char *)in_stack_fffffffffffff930.data_,
                                (char *)in_stack_fffffffffffff938.ptr_);
          local_574 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                     in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_570);
          if (!bVar1) {
            testing::Message::Message(&local_580);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b97b1);
            testing::internal::AssertHelper::AssertHelper
                      (&local_588,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x105,pcVar4);
            testing::internal::AssertHelper::operator=(&local_588,&local_580);
            testing::internal::AssertHelper::~AssertHelper(&local_588);
            testing::Message::~Message((Message *)0x3b9814);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b9869);
        }
      }
      if (local_2c == 0) {
        local_778 = (char *)0x0;
        local_2c = CfdFinalizeTransaction(in_stack_fffffffffffff4b0,local_958,(char **)0x3bb013);
        local_78c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                   in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_788);
        if (!bVar1) {
          testing::Message::Message(&local_798);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bb0b5);
          testing::internal::AssertHelper::AssertHelper
                    (&local_7a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x164,pcVar4);
          testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
          testing::internal::AssertHelper::~AssertHelper(&local_7a0);
          testing::Message::~Message((Message *)0x3bb118);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bb170);
        if (local_2c == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_7b0,"exp_datas[idx].signed_tx","tx_hex",
                     *(char **)(abStack_3e8 + local_478 * 0x88 + -8),local_778);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7b0);
          if (!bVar1) {
            testing::Message::Message((Message *)&stack0xfffffffffffff848);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bb233);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff840,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x166,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff840,(Message *)&stack0xfffffffffffff848)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff840)
            ;
            testing::Message::~Message((Message *)0x3bb296);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bb2eb);
          CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
        }
      }
      if (local_2c == 0) {
        local_2c = CfdVerifyTxSignByHandle
                             (in_stack_fffffffffffff648,
                              (void *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
                              &in_stack_fffffffffffff638->success_,
                              (uint32_t)((ulong)in_stack_fffffffffffff630 >> 0x20));
        if ((local_2c != 0) && ((local_559 & 1) != 0)) {
          pcVar4 = (char *)0x0;
          CfdGetLastErrorMessage(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
          in_stack_fffffffffffff830 = "The script analysis of tapscript is not supported.";
          in_stack_fffffffffffff548 = (AssertionResult *)(local_7e8 + 1);
          testing::internal::CmpHelperSTREQ
                    ((internal *)in_stack_fffffffffffff548,"tapscript_err_msg","err_msg",
                     "The script analysis of tapscript is not supported.",pcVar4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff548);
          if (!bVar1) {
            testing::Message::Message(local_7e8);
            in_stack_fffffffffffff540 =
                 (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3bb449);
            testing::internal::AssertHelper::AssertHelper
                      (&local_7f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x172,(char *)in_stack_fffffffffffff540);
            testing::internal::AssertHelper::operator=(&local_7f0,local_7e8);
            testing::internal::AssertHelper::~AssertHelper(&local_7f0);
            testing::Message::~Message((Message *)0x3bb4ac);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bb501);
          iVar3 = strcmp(in_stack_fffffffffffff830,pcVar4);
          if (iVar3 == 0) {
            local_2c = 0;
          }
          CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
          in_stack_fffffffffffff838 = (char *)0x0;
        }
        local_804 = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                   in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_800);
        if (!bVar1) {
          testing::Message::Message(&local_810);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bb5ee);
          testing::internal::AssertHelper::AssertHelper
                    (&local_818,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x179,pcVar4);
          testing::internal::AssertHelper::operator=(&local_818,&local_810);
          testing::internal::AssertHelper::~AssertHelper(&local_818);
          testing::Message::~Message((Message *)0x3bb651);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bb6a6);
        if (local_2c != 0) {
          in_stack_fffffffffffff7d4 = 0xffffffff;
          testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                    ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                     in_stack_fffffffffffff4b8,(unsigned_long *)in_stack_fffffffffffff4b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_828);
          if (!bVar1) {
            testing::Message::Message(&local_838);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bb755);
            testing::internal::AssertHelper::AssertHelper
                      (&local_840,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x17b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_840,&local_838);
            testing::internal::AssertHelper::~AssertHelper(&local_840);
            testing::Message::~Message((Message *)0x3bb7b2);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bb807);
        }
      }
      in_stack_fffffffffffff7bc = CfdFreeTransactionHandle(in_stack_fffffffffffff4b0,local_958);
      in_stack_fffffffffffff7a4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                 in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff7a8);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffff798);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bb8c8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_870,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x180,pcVar4);
        testing::internal::AssertHelper::operator=(&local_870,(Message *)&stack0xfffffffffffff798);
        testing::internal::AssertHelper::~AssertHelper(&local_870);
        testing::Message::~Message((Message *)0x3bb925);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bb97a);
    }
  }
  local_2c = CfdFreeHandle(in_stack_fffffffffffff4b8);
  local_884 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
             (int *)in_stack_fffffffffffff4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_880);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bba4c);
    testing::internal::AssertHelper::AssertHelper
              (&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x192,pcVar4);
    testing::internal::AssertHelper::operator=(&local_898,&local_890);
    testing::internal::AssertHelper::~AssertHelper(&local_898);
    testing::Message::~Message((Message *)0x3bbaa9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bbafe);
  return;
}

Assistant:

TEST(cfdcapi_transaction, SignTransactionTest) {
  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdSignTransactionTestData {
    int network;
    const char* txid;
    uint32_t vout;
    const char* descriptor;
    int64_t utxo_amount;
    const char* redeem_script;
    const char* tapscript_control;
    const char* tapleaf_hash;
    const char* annex;
    const char* aux_rand;
    const char* pubkey;
    const char* privkey;
    int sighash_type;
    const char* txout_address;
    int64_t amount;
    const char* signed_tx;
    bool use_direct_sign;
    int hash_type;
  };
  const struct CfdSignTransactionTestData exp_datas[] = {
    {  // p2wpkh
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000",
      false, kCfdP2wpkh
    },
    {  // p2wpkh auto sign
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000",
      true, kCfdP2wpkh
    },
    {  // p2wsh-multisig
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wsh(multi(1,023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae))",
      2500000000,
      "5121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c442103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae52ae",
      nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20300473044022050da44f8a8e8ac494b79840c4c7ef7d55a296ffa0b98a5b9d2150964ba6d555802207ae9ec8a4f060440279fa9129ef480132cab1fc638c534ef31af1feda6b5d6f401475121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c442103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae52ae00000000",
      false, kCfdP2wsh
    },
    {  // taproot schnorr
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014161f75636003a870b7a1685abae84eedf8c9527227ac70183c376f7b3a35b07ebcbea14749e58ce1a87565b035b2f3963baa5ae3ede95e89fd607ab7849f208720100000000",
      false, kCfdTaproot
    },
    {  // taproot schnorr auto sign
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014161f75636003a870b7a1685abae84eedf8c9527227ac70183c376f7b3a35b07ebcbea14749e58ce1a87565b035b2f3963baa5ae3ede95e89fd607ab7849f208720100000000",
      true, kCfdTaproot
    },
    {  // taproot schnorr rand
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916",
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014151df55894d1a024c244e20ecedc39cae39fa6d43653305b7f32605eea6359415a7ceef44c52a2f26be2e06d33d79c2e90b5dfaebcb4f79e242134121e0b9579e0100000000",
      false, kCfdTaproot
    },
    {  // tapscript
      kCfdNetworkRegtest,
      "195d6c18afaa6c33dcc2da86c6c0cd3f93ec2b44e4c8e9be00c7000eafa1805b", 0,
      "raw(51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2)",
      2499999000,
      "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
      "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
      "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
      nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000",
      false, kCfdTaproot
    },
  };
  size_t list_size = sizeof(exp_datas) / sizeof(struct CfdSignTransactionTestData);

  for (size_t idx = 0; idx < list_size; ++idx) {
    void* create_handle = nullptr;
    char* sighash = nullptr;
    char* sig = nullptr;
    char* tmp_sig = nullptr;
    ret = CfdInitializeTransaction(
        handle, exp_datas[idx].network, 2, 0, nullptr, &create_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((NULL == create_handle));
    if (ret == kCfdSuccess) {
      ret = CfdSetTransactionUtxoData(handle, create_handle,
          exp_datas[idx].txid, exp_datas[idx].vout, exp_datas[idx].utxo_amount,
          nullptr, exp_datas[idx].descriptor, nullptr, nullptr, nullptr, true);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTransactionOutput(handle, create_handle,
          exp_datas[idx].amount, exp_datas[idx].txout_address, nullptr, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);

      bool has_tapscript = false;
      if (ret != kCfdSuccess) {
        // do nothing
      } else if (exp_datas[idx].use_direct_sign) {
        ret = CfdAddSignWithPrivkeyByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout, exp_datas[idx].privkey,
            exp_datas[idx].sighash_type, false, true, exp_datas[idx].aux_rand,
            exp_datas[idx].annex);
        EXPECT_EQ(kCfdSuccess, ret);
      } else {
        uint32_t code_separator_pos = cfd::core::kDefaultCodeSeparatorPosition;
        ret = CfdCreateSighashByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout,
            exp_datas[idx].sighash_type, false,
            (exp_datas[idx].redeem_script) ? nullptr : exp_datas[idx].pubkey,
            exp_datas[idx].redeem_script,
            exp_datas[idx].tapleaf_hash, code_separator_pos,
            exp_datas[idx].annex, &sighash);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret != kCfdSuccess) {
          // do nothing
        } else if (strlen(exp_datas[idx].pubkey) == 64) {
          // taproot/tapscript
          ret = CfdSignSchnorr(handle, sighash,
              exp_datas[idx].privkey, exp_datas[idx].aux_rand, &tmp_sig);
          EXPECT_EQ(kCfdSuccess, ret);
          ret = CfdAddSighashTypeInSchnorrSignature(handle, tmp_sig,
              exp_datas[idx].sighash_type, false, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          if (exp_datas[idx].redeem_script != nullptr) {
            has_tapscript = true;
            ret = CfdAddTxSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                exp_datas[idx].hash_type, sig, false,
                exp_datas[idx].sighash_type, false, true);
            EXPECT_EQ(kCfdSuccess, ret);

            ret = CfdAddTaprootSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                nullptr, exp_datas[idx].redeem_script,
                exp_datas[idx].tapscript_control, exp_datas[idx].annex);
            EXPECT_EQ(kCfdSuccess, ret);
          } else {
            ret = CfdAddTaprootSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                sig, nullptr, nullptr, exp_datas[idx].annex);
            EXPECT_EQ(kCfdSuccess, ret);
          }
        } else if (exp_datas[idx].redeem_script != nullptr) {
          // script
          ret = CfdCalculateEcSignature(handle, sighash,
              exp_datas[idx].privkey, nullptr,
              exp_datas[idx].network, true, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          // multisig first
          ret = CfdAddTxSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, "", false,
              exp_datas[idx].sighash_type, false, true);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddTxSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, sig, true,
              exp_datas[idx].sighash_type, false, false);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddScriptHashLastSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, exp_datas[idx].redeem_script);
          EXPECT_EQ(kCfdSuccess, ret);
        } else {
          ret = CfdCalculateEcSignature(handle, sighash,
              exp_datas[idx].privkey, nullptr,
              exp_datas[idx].network, true, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddPubkeyHashSignByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout,
            exp_datas[idx].hash_type, exp_datas[idx].pubkey,
            sig, true, exp_datas[idx].sighash_type, false);
          EXPECT_EQ(kCfdSuccess, ret);
        }

        if (sighash != nullptr) {
          CfdFreeStringBuffer(sighash);
          sighash = nullptr;
        }
        if (sig != nullptr) {
          CfdFreeStringBuffer(sig);
          sig = nullptr;
        }
        if (tmp_sig != nullptr) {
          CfdFreeStringBuffer(tmp_sig);
          tmp_sig = nullptr;
        }
      }

      if (ret == kCfdSuccess) {
        char* tx_hex = nullptr;
        ret = CfdFinalizeTransaction(handle, create_handle, &tx_hex);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          EXPECT_STREQ(exp_datas[idx].signed_tx, tx_hex);
          CfdFreeStringBuffer(tx_hex);
        }
      }

      if (ret == kCfdSuccess) {
        ret = CfdVerifyTxSignByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout);
        if ((ret != kCfdSuccess) && has_tapscript) {
          char* err_msg = NULL;
          CfdGetLastErrorMessage(handle, &err_msg);
          const char* tapscript_err_msg = "The script analysis of tapscript is not supported.";
          EXPECT_STREQ(tapscript_err_msg, err_msg);
          if (strcmp(tapscript_err_msg, err_msg) == 0) {
            ret = kCfdSuccess;
          }
          CfdFreeStringBuffer(err_msg);
          err_msg = NULL;
        }
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret != kCfdSuccess) {
          EXPECT_EQ(-1, idx);
        }
      }

      int tmp_ret = CfdFreeTransactionHandle(handle, create_handle);
      EXPECT_EQ(kCfdSuccess, tmp_ret);
    }

#if 0
    ret = CfdGetLastErrorCode(handle);
    if (ret != kCfdSuccess) {
      char* str_buffer = NULL;
      ret = CfdGetLastErrorMessage(handle, &str_buffer);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("", str_buffer);
      CfdFreeStringBuffer(str_buffer);
      str_buffer = NULL;
      break;
    }
#endif
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}